

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O3

void __thiscall cbtTaskSchedulerDefault::setNumThreads(cbtTaskSchedulerDefault *this,int numThreads)

{
  int i;
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (this->m_maxNumThreads < numThreads) {
    numThreads = this->m_maxNumThreads;
  }
  iVar1 = 1;
  if (1 < numThreads) {
    iVar1 = numThreads;
  }
  this->m_numThreads = iVar1;
  this->m_numWorkerThreads = iVar1 - 1U;
  this->m_numActiveJobQueues = 0;
  if ((1 < numThreads) &&
     (this->m_numActiveJobQueues =
           (int)((ulong)((long)(this->m_perThreadJobQueues).m_data[iVar1 - 1U] -
                        (long)(this->m_jobQueues).m_data) >> 3) * -0x1642c859 + 1,
     0 < (this->m_jobQueues).m_size)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      JobQueue::setupJobStealing
                ((JobQueue *)(((this->m_jobQueues).m_data)->m_cachePadding + lVar3 + -0x78),
                 &this->m_jobQueues,this->m_numActiveJobQueues);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0xb8;
    } while (lVar2 < (this->m_jobQueues).m_size);
    iVar1 = this->m_numThreads;
  }
  if (iVar1 < 0x40) {
    memset(this->m_workerDirective + iVar1,1,(ulong)(0x3f - iVar1) + 1);
    return;
  }
  return;
}

Assistant:

virtual void setNumThreads(int numThreads) BT_OVERRIDE
	{
		m_numThreads = cbtMax(cbtMin(numThreads, int(m_maxNumThreads)), 1);
		m_numWorkerThreads = m_numThreads - 1;
		m_numActiveJobQueues = 0;
		// if there is at least 1 worker,
		if (m_numWorkerThreads > 0)
		{
			// re-setup job stealing between queues to avoid attempting to steal from an inactive job queue
			JobQueue* lastActiveContext = m_perThreadJobQueues[m_numThreads - 1];
			int iLastActiveContext = lastActiveContext - &m_jobQueues[0];
			m_numActiveJobQueues = iLastActiveContext + 1;
			for (int i = 0; i < m_jobQueues.size(); ++i)
			{
				m_jobQueues[i].setupJobStealing(&m_jobQueues, m_numActiveJobQueues);
			}
		}
		m_workerDirective->setDirectiveByRange(m_numThreads, BT_MAX_THREAD_COUNT, WorkerThreadDirectives::kGoToSleep);
	}